

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_accept.c
# Opt level: O1

int mpt_parse_accept(mpt_parser_allow *flg,char *name)

{
  ushort uVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  ushort **ppuVar5;
  __int32_t **pp_Var6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  char *pcVar11;
  long lVar12;
  
  if (name == (char *)0x0) {
    flg->sect = 0xff;
    flg->opt = 0xff;
  }
  else {
    if (*name != '\0') {
      bVar10 = 0;
      bVar9 = 0;
      pcVar11 = name;
      do {
        lVar12 = (long)*pcVar11;
        if (lVar12 == 0) goto LAB_0011940a;
        ppuVar5 = __ctype_b_loc();
        uVar1 = (*ppuVar5)[lVar12];
        iVar4 = 3;
        if ((uVar1 >> 0xd & 1) == 0) {
          pp_Var6 = __ctype_tolower_loc();
          iVar2 = (*pp_Var6)[lVar12];
          iVar4 = 1;
          if (iVar2 < 0x6e) {
            switch(iVar2) {
            case 0x62:
              bVar7 = 0x20;
              break;
            case 99:
              bVar7 = 2;
              break;
            default:
              goto switchD_001193b2_caseD_64;
            case 0x65:
              bVar7 = 0x10;
              break;
            case 0x66:
              bVar7 = 1;
            }
          }
          else if (iVar2 == 0x6e) {
            bVar7 = 3;
          }
          else if (iVar2 == 0x73) {
            bVar7 = 4;
          }
          else {
            if (iVar2 != 0x77) goto switchD_001193b2_caseD_64;
            bVar7 = 8;
          }
          iVar4 = 0;
          if ((uVar1 >> 8 & 1) == 0) {
            bVar3 = 0;
            bVar8 = bVar7;
          }
          else {
            bVar8 = 0;
            bVar3 = bVar7;
          }
          bVar10 = bVar3 | bVar10;
          bVar9 = bVar8 | bVar9;
          pcVar11 = pcVar11 + 1;
        }
switchD_001193b2_caseD_64:
      } while (iVar4 == 0);
      if (iVar4 != 3) {
        return -2;
      }
LAB_0011940a:
      flg->sect = (ushort)bVar10;
      flg->opt = (ushort)bVar9;
      return (int)pcVar11 - (int)name;
    }
    flg->sect = 2;
    flg->opt = 2;
  }
  return 0;
}

Assistant:

extern int mpt_parse_accept(MPT_STRUCT(parser_allow) *flg, const char *name)
{
	const char *end = name;
	uint8_t sect = 0, opt = 0;
	
	if (!end) {
		flg->sect = flg->opt = 0xff;
		return 0;
	}
	if (!*end) {
		flg->sect = flg->opt = MPT_NAMEFLAG(NumCont);
		return 0;
	}
	while (*end) {
		int type;
		
		if (isspace(*end)) {
			break;
		}
		switch (type = tolower(*end)) {
		  case 'f': type = MPT_NAMEFLAG(NumStart); break;
		  case 'c': type = MPT_NAMEFLAG(NumCont); break;
		  case 'n': type = MPT_NAMEFLAG(Numeral); break;
		  case 's': type = MPT_NAMEFLAG(Special); break;
		  case 'w': type = MPT_NAMEFLAG(Space); break;
		  
		  case 'e': type = MPT_NAMEFLAG(Empty); break;
		  case 'b': type = MPT_NAMEFLAG(Binary); break;
		  default: return -2;
		}
		if (isupper(*end)) {
			sect |= type;
		} else {
			opt |= type;
		}
		++end;
	}
	flg->sect = sect;
	flg->opt  = opt;
	
	return end - name;
}